

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

ssize_t __thiscall DomConnection::read(DomConnection *this,int __fd,void *__buf,size_t __nbytes)

{
  QStringView other;
  QStringView other_00;
  QStringView other_01;
  QStringView other_02;
  QStringView other_03;
  bool bVar1;
  int iVar2;
  int iVar3;
  size_t __nbytes_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  DomConnection *size;
  long in_FS_OFFSET;
  DomConnectionHints *v;
  QStringView tag;
  QStringBuilder<QLatin1String,_const_QStringView_&> *in_stack_fffffffffffffe38;
  DomConnection *in_stack_fffffffffffffe40;
  DomConnectionHints *in_stack_fffffffffffffe48;
  undefined7 in_stack_fffffffffffffe50;
  byte in_stack_fffffffffffffe57;
  byte in_stack_fffffffffffffe58;
  byte in_stack_fffffffffffffe59;
  byte in_stack_fffffffffffffe5a;
  byte in_stack_fffffffffffffe5b;
  DomConnectionHints *in_stack_fffffffffffffe68;
  undefined1 local_118 [64];
  undefined1 local_d8 [64];
  undefined1 local_98 [64];
  undefined1 local_58 [64];
  undefined1 local_18 [16];
  long local_8;
  
  size = (DomConnection *)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    while( true ) {
      bVar1 = QXmlStreamReader::hasError((QXmlStreamReader *)0x1c426a);
      if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_001c46aa;
      iVar2 = QXmlStreamReader::readNext();
      if (iVar2 != 4) break;
      local_18._0_8_ = 0xaaaaaaaaaaaaaaaa;
      local_18._8_8_ = 0xaaaaaaaaaaaaaaaa;
      local_18 = QXmlStreamReader::name();
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)
                 CONCAT44(iVar2,CONCAT13(in_stack_fffffffffffffe5b,
                                         CONCAT12(in_stack_fffffffffffffe5a,
                                                  CONCAT11(in_stack_fffffffffffffe59,
                                                           in_stack_fffffffffffffe58)))),
                 CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
      QStringView::QStringView<QString,_true>
                ((QStringView *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                 (QString *)in_stack_fffffffffffffe48);
      other.m_data = (storage_type_conflict *)in_stack_fffffffffffffe68;
      other.m_size = (qsizetype)this;
      iVar3 = QStringView::compare((QStringView *)in_stack_fffffffffffffe38,other,CaseInsensitive);
      in_stack_fffffffffffffe5b = iVar3 != 0 ^ 0xff;
      QString::~QString((QString *)0x1c433c);
      if ((in_stack_fffffffffffffe5b & 1) == 0) {
        Qt::Literals::StringLiterals::operator____s
                  ((char16_t *)
                   CONCAT44(iVar2,CONCAT13(in_stack_fffffffffffffe5b,
                                           CONCAT12(in_stack_fffffffffffffe5a,
                                                    CONCAT11(in_stack_fffffffffffffe59,
                                                             in_stack_fffffffffffffe58)))),
                   CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
        QStringView::QStringView<QString,_true>
                  ((QStringView *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                   (QString *)in_stack_fffffffffffffe48);
        other_00.m_data = (storage_type_conflict *)in_stack_fffffffffffffe68;
        other_00.m_size = (qsizetype)this;
        iVar3 = QStringView::compare
                          ((QStringView *)in_stack_fffffffffffffe38,other_00,CaseInsensitive);
        in_stack_fffffffffffffe5a = iVar3 != 0 ^ 0xff;
        QString::~QString((QString *)0x1c43e4);
        if ((in_stack_fffffffffffffe5a & 1) == 0) {
          Qt::Literals::StringLiterals::operator____s
                    ((char16_t *)
                     CONCAT44(iVar2,CONCAT13(in_stack_fffffffffffffe5b,
                                             CONCAT12(in_stack_fffffffffffffe5a,
                                                      CONCAT11(in_stack_fffffffffffffe59,
                                                               in_stack_fffffffffffffe58)))),
                     CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
          QStringView::QStringView<QString,_true>
                    ((QStringView *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                     (QString *)in_stack_fffffffffffffe48);
          other_01.m_data = (storage_type_conflict *)in_stack_fffffffffffffe68;
          other_01.m_size = (qsizetype)this;
          iVar3 = QStringView::compare
                            ((QStringView *)in_stack_fffffffffffffe38,other_01,CaseInsensitive);
          in_stack_fffffffffffffe59 = iVar3 != 0 ^ 0xff;
          QString::~QString((QString *)0x1c448c);
          if ((in_stack_fffffffffffffe59 & 1) == 0) {
            Qt::Literals::StringLiterals::operator____s
                      ((char16_t *)
                       CONCAT44(iVar2,CONCAT13(in_stack_fffffffffffffe5b,
                                               CONCAT12(in_stack_fffffffffffffe5a,
                                                        CONCAT11(in_stack_fffffffffffffe59,
                                                                 in_stack_fffffffffffffe58)))),
                       CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
            QStringView::QStringView<QString,_true>
                      ((QStringView *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                       (QString *)in_stack_fffffffffffffe48);
            other_02.m_data = (storage_type_conflict *)in_stack_fffffffffffffe68;
            other_02.m_size = (qsizetype)this;
            iVar3 = QStringView::compare
                              ((QStringView *)in_stack_fffffffffffffe38,other_02,CaseInsensitive);
            in_stack_fffffffffffffe58 = iVar3 != 0 ^ 0xff;
            QString::~QString((QString *)0x1c4534);
            if ((in_stack_fffffffffffffe58 & 1) == 0) {
              Qt::Literals::StringLiterals::operator____s
                        ((char16_t *)
                         CONCAT44(iVar2,CONCAT13(in_stack_fffffffffffffe5b,
                                                 CONCAT12(in_stack_fffffffffffffe5a,
                                                          CONCAT11(in_stack_fffffffffffffe59,
                                                                   in_stack_fffffffffffffe58)))),
                         CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
              QStringView::QStringView<QString,_true>
                        ((QStringView *)
                         CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                         (QString *)in_stack_fffffffffffffe48);
              __nbytes_00 = 0;
              other_03.m_data = (storage_type_conflict *)in_stack_fffffffffffffe68;
              other_03.m_size = (qsizetype)this;
              iVar2 = QStringView::compare
                                ((QStringView *)in_stack_fffffffffffffe38,other_03,CaseInsensitive);
              in_stack_fffffffffffffe57 = iVar2 != 0 ^ 0xff;
              QString::~QString((QString *)0x1c45dc);
              if ((in_stack_fffffffffffffe57 & 1) == 0) {
                in_stack_fffffffffffffe40 = size;
                Qt::Literals::StringLiterals::operator____L1
                          ((char *)in_stack_fffffffffffffe48,(size_t)size);
                ::operator+((QLatin1String *)in_stack_fffffffffffffe40,
                            (QStringView *)in_stack_fffffffffffffe38);
                ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffe38);
                QXmlStreamReader::raiseError((QString *)in_stack_fffffffffffffe40);
                QString::~QString((QString *)0x1c469f);
              }
              else {
                in_stack_fffffffffffffe48 = (DomConnectionHints *)operator_new(0x20);
                memset(in_stack_fffffffffffffe48,0,0x20);
                DomConnectionHints::DomConnectionHints((DomConnectionHints *)0x1c460e);
                in_stack_fffffffffffffe68 = in_stack_fffffffffffffe48;
                DomConnectionHints::read(in_stack_fffffffffffffe48,__fd,__buf_00,__nbytes_00);
                setElementHints((DomConnection *)
                                CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                                in_stack_fffffffffffffe48);
              }
            }
            else {
              QXmlStreamReader::readElementText(local_118,size,0);
              setElementSlot(in_stack_fffffffffffffe40,(QString *)in_stack_fffffffffffffe38);
              QString::~QString((QString *)0x1c4571);
            }
          }
          else {
            QXmlStreamReader::readElementText(local_d8,size,0);
            setElementReceiver(in_stack_fffffffffffffe40,(QString *)in_stack_fffffffffffffe38);
            QString::~QString((QString *)0x1c44c9);
          }
        }
        else {
          QXmlStreamReader::readElementText(local_98,size,0);
          setElementSignal(in_stack_fffffffffffffe40,(QString *)in_stack_fffffffffffffe38);
          QString::~QString((QString *)0x1c4421);
        }
      }
      else {
        QXmlStreamReader::readElementText(local_58,size,0);
        setElementSender(in_stack_fffffffffffffe40,(QString *)in_stack_fffffffffffffe38);
        QString::~QString((QString *)0x1c4379);
      }
    }
  } while (iVar2 != 5);
LAB_001c46aa:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomConnection::read(QXmlStreamReader &reader)
{
    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"sender"_s, Qt::CaseInsensitive)) {
                setElementSender(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"signal"_s, Qt::CaseInsensitive)) {
                setElementSignal(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"receiver"_s, Qt::CaseInsensitive)) {
                setElementReceiver(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"slot"_s, Qt::CaseInsensitive)) {
                setElementSlot(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"hints"_s, Qt::CaseInsensitive)) {
                auto *v = new DomConnectionHints();
                v->read(reader);
                setElementHints(v);
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}